

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

float4x4 * ConvexDecomposition::MatrixRigidInverse(float4x4 *__return_storage_ptr__,float4x4 *m)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  float4x4 local_88;
  float4x4 local_48;
  
  local_48.x.x = 1.0;
  local_48.x.y = 0.0;
  local_48.x.z = 0.0;
  local_48.x.w = 0.0;
  local_48.y.x = 0.0;
  local_48.y.y = 1.0;
  local_48.y.z = 0.0;
  local_48.y.w = 0.0;
  local_48.z.x = 0.0;
  local_48.z.y = 0.0;
  local_48.w.z = -(m->w).z;
  local_48.z._8_8_ = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  uVar1._0_4_ = (m->w).x;
  uVar1._4_4_ = (m->w).y;
  auVar2._0_8_ = uVar1 ^ 0x8000000080000000;
  auVar2._8_4_ = 0x80000000;
  auVar2._12_4_ = 0x80000000;
  local_48.w._0_8_ = vmovlps_avx(auVar2);
  local_48.w.w = 1.0;
  local_88.x.x = (m->x).x;
  local_88.y.x = (m->x).y;
  local_88.z.x = (m->x).z;
  local_88.w.x = (m->x).w;
  local_88.x.y = (m->y).x;
  local_88.y.y = (m->y).y;
  local_88.z.y = (m->y).z;
  local_88.w.y = (m->y).w;
  local_88.x.z = (m->z).x;
  local_88.y.z = (m->z).y;
  local_88.z.z = (m->z).z;
  local_88.w.z = (m->z).w;
  local_88.x.w = 0.0;
  local_88.y.w = 0.0;
  local_88.z.w = 0.0;
  local_88.w.w = 1.0;
  operator*(__return_storage_ptr__,&local_48,&local_88);
  return __return_storage_ptr__;
}

Assistant:

float4x4 MatrixRigidInverse(const float4x4 &m)
{
	float4x4 trans_inverse = MatrixTranslation(-m.w.xyz());
	float4x4 rot   = m;
	rot.w = float4(0,0,0,1);
	return trans_inverse * MatrixTranspose(rot);
}